

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall sentencepiece::ModelProto::InternalSwap(ModelProto *this,ModelProto *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  void *pvVar2;
  Rep *pRVar3;
  Rep *pRVar4;
  TrainerSpec *pTVar5;
  NormalizerSpec *pNVar6;
  NormalizerSpec *pNVar7;
  SelfTestData *pSVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar12 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar2 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar12 & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_001e9aaf;
  }
  else if (((ulong)pvVar2 & 1) == 0) {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (&(other->super_MessageLite)._internal_metadata_);
    pvVar12 = this_00->ptr_;
  }
  if (((ulong)pvVar12 & 1) == 0) {
    pbVar13 = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
  }
  else {
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (((ulong)pvVar12 & 0xfffffffffffffffe) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar13);
LAB_001e9aaf:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  iVar10 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  iVar11 = (this->pieces_).super_RepeatedPtrFieldBase.total_size_;
  pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
  iVar9 = (other->pieces_).super_RepeatedPtrFieldBase.total_size_;
  pRVar4 = (other->pieces_).super_RepeatedPtrFieldBase.rep_;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ =
       (other->pieces_).super_RepeatedPtrFieldBase.current_size_;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = iVar9;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  (other->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
  (other->pieces_).super_RepeatedPtrFieldBase.total_size_ = iVar11;
  (other->pieces_).super_RepeatedPtrFieldBase.rep_ = pRVar3;
  pTVar5 = this->trainer_spec_;
  pNVar6 = this->normalizer_spec_;
  pNVar7 = other->normalizer_spec_;
  this->trainer_spec_ = other->trainer_spec_;
  this->normalizer_spec_ = pNVar7;
  other->trainer_spec_ = pTVar5;
  other->normalizer_spec_ = pNVar6;
  pSVar8 = this->self_test_data_;
  pNVar6 = this->denormalizer_spec_;
  pNVar7 = other->denormalizer_spec_;
  this->self_test_data_ = other->self_test_data_;
  this->denormalizer_spec_ = pNVar7;
  other->self_test_data_ = pSVar8;
  other->denormalizer_spec_ = pNVar6;
  return;
}

Assistant:

void ModelProto::InternalSwap(ModelProto* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pieces_.InternalSwap(&other->pieces_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ModelProto, denormalizer_spec_)
      + sizeof(ModelProto::denormalizer_spec_)
      - PROTOBUF_FIELD_OFFSET(ModelProto, trainer_spec_)>(
          reinterpret_cast<char*>(&trainer_spec_),
          reinterpret_cast<char*>(&other->trainer_spec_));
}